

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O3

void __thiscall
efsw::DirectorySnapshot::deleteAll(DirectorySnapshot *this,DirectorySnapshotDiff *Diff)

{
  FileInfoList *pFVar1;
  bool bVar2;
  size_t *psVar3;
  _Node *p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  _Self __tmp;
  FileInfo fi;
  FileInfo local_78;
  
  FileInfo::FileInfo(&local_78);
  p_Var5 = (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->Files)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var6) {
    do {
      FileInfo::operator=(&local_78,(FileInfo *)(p_Var5 + 2));
      bVar2 = FileInfo::isDirectory(&local_78);
      if (bVar2) {
        p_Var4 = std::__cxx11::list<efsw::FileInfo,std::allocator<efsw::FileInfo>>::
                 _M_create_node<efsw::FileInfo_const&>
                           ((list<efsw::FileInfo,std::allocator<efsw::FileInfo>> *)
                            &Diff->DirsDeleted,&local_78);
        std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
        pFVar1 = &Diff->DirsDeleted;
      }
      else {
        p_Var4 = std::__cxx11::list<efsw::FileInfo,std::allocator<efsw::FileInfo>>::
                 _M_create_node<efsw::FileInfo_const&>
                           ((list<efsw::FileInfo,std::allocator<efsw::FileInfo>> *)Diff,&local_78);
        std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
        pFVar1 = &Diff->FilesDeleted;
      }
      psVar3 = &(pFVar1->super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>)._M_impl.
                _M_node._M_size;
      *psVar3 = *psVar3 + 1;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var6);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.Filepath._M_dataplus._M_p != &local_78.Filepath.field_2) {
    operator_delete(local_78.Filepath._M_dataplus._M_p,
                    local_78.Filepath.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void DirectorySnapshot::deleteAll( DirectorySnapshotDiff& Diff )
{
	FileInfo fi;

	for ( FileInfoMap::iterator it = Files.begin(); it != Files.end(); it++ )
	{
		fi = it->second;

		if ( fi.isDirectory() )
		{
			Diff.DirsDeleted.push_back( fi );
		}
		else
		{
			Diff.FilesDeleted.push_back( fi );
		}
	}
}